

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O0

void ToStringHelper(ON_COMPONENT_INDEX ci,char *buffer,size_t sizeof_buffer)

{
  char cVar1;
  char *pcVar2;
  uint local_70;
  char c_3;
  char c_2;
  char c_1;
  char c;
  uint j;
  uint i;
  char ubuffer [32];
  char *str_end;
  char *s;
  size_t str_capacity;
  char *str;
  size_t sizeof_buffer_local;
  char *buffer_local;
  ON_COMPONENT_INDEX ci_local;
  
  if ((buffer != (char *)0x0) && (sizeof_buffer != 0)) {
    buffer[sizeof_buffer - 1] = '\0';
    if (sizeof_buffer - 1 != 0) {
      pcVar2 = buffer + (sizeof_buffer - 1);
      str_end = "m_type=";
      str_capacity = (size_t)buffer;
      while (str_capacity < pcVar2) {
        if (*str_end == '\0') break;
        *(char *)str_capacity = *str_end;
        str_end = str_end + 1;
        str_capacity = str_capacity + 1;
      }
      buffer_local._0_4_ = ci.m_type;
      if ((TYPE)buffer_local + brep_vertex < 0x6b || (TYPE)buffer_local == dim_leader_point) {
        (*(code *)(&DAT_00a04a88 +
                  *(int *)(&DAT_00a04a88 + (ulong)((TYPE)buffer_local + brep_vertex) * 4)))();
        return;
      }
      str_end = " m_index=";
      while (str_capacity < pcVar2) {
        if (*str_end == '\0') break;
        *(char *)str_capacity = *str_end;
        str_end = str_end + 1;
        str_capacity = str_capacity + 1;
      }
      buffer_local._4_4_ = ci.m_index;
      if ((int)buffer_local._4_4_ < 1) {
        _c_3 = -buffer_local._4_4_;
        str_end = "-";
        while (str_capacity < pcVar2) {
          if (*str_end == '\0') break;
          *(char *)str_capacity = *str_end;
          str_end = str_end + 1;
          str_capacity = str_capacity + 1;
        }
      }
      else {
        _c_3 = buffer_local._4_4_;
      }
      local_70 = 0x1f;
      ubuffer[0x17] = '\0';
      do {
        if (local_70 == 0) break;
        local_70 = local_70 - 1;
        *(char *)((long)&j + (ulong)local_70) = (char)(_c_3 % 10) + '0';
        _c_3 = _c_3 / 10;
      } while (_c_3 != 0);
      str_end = (char *)((long)&j + (ulong)local_70);
      do {
        if (pcVar2 <= str_capacity) {
          return;
        }
        cVar1 = *str_end;
        *(char *)str_capacity = cVar1;
        str_end = str_end + 1;
        str_capacity = str_capacity + 1;
      } while (cVar1 != '\0');
    }
  }
  return;
}

Assistant:

static void ToStringHelper( ON_COMPONENT_INDEX ci, char* buffer, size_t sizeof_buffer )
{
  char* str = buffer;
  size_t str_capacity = sizeof_buffer/sizeof(buffer[0]);
  const char* s;
  const char* str_end;
  char ubuffer[32]; // unsigned int to string storage ubuffer
  unsigned int i, j;

  if ( nullptr == str || str_capacity <= 0 )
    return;

  str[--str_capacity] = 0;
  if (str_capacity <= 0)
    return;

  str_end = str + str_capacity;

  s = "m_type=";
  while ( str < str_end )
  {
    const char c = *s++;
    if (0 == c)
      break;

    *str++ = c;
  }

  switch(ci.m_type)
  {
  case ON_COMPONENT_INDEX::no_type:            s = "ON_COMPONENT_INDEX::no_type";            break;
  
  case ON_COMPONENT_INDEX::brep_vertex:        s = "ON_COMPONENT_INDEX::brep_vertex";        break;
  case ON_COMPONENT_INDEX::brep_edge:          s = "ON_COMPONENT_INDEX::brep_edge";          break;
  case ON_COMPONENT_INDEX::brep_face:          s = "ON_COMPONENT_INDEX::brep_face";          break;
  case ON_COMPONENT_INDEX::brep_trim:          s = "ON_COMPONENT_INDEX::brep_trim";          break;
  case ON_COMPONENT_INDEX::brep_loop:          s = "ON_COMPONENT_INDEX::brep_loop";          break;
  
  case ON_COMPONENT_INDEX::mesh_vertex:        s = "ON_COMPONENT_INDEX::mesh_vertex";        break;
  case ON_COMPONENT_INDEX::meshtop_vertex:     s = "ON_COMPONENT_INDEX::meshtop_vertex";     break;
  case ON_COMPONENT_INDEX::meshtop_edge:       s = "ON_COMPONENT_INDEX::meshtop_edge";       break;
  case ON_COMPONENT_INDEX::mesh_face:          s = "ON_COMPONENT_INDEX::mesh_face";          break;
  case ON_COMPONENT_INDEX::mesh_ngon:          s = "ON_COMPONENT_INDEX::mesh_ngon";          break;

  case ON_COMPONENT_INDEX::idef_part:          s = "ON_COMPONENT_INDEX::idef_part";          break;
  case ON_COMPONENT_INDEX::polycurve_segment:  s = "ON_COMPONENT_INDEX::polycurve_segment";  break;
  case ON_COMPONENT_INDEX::pointcloud_point:   s = "ON_COMPONENT_INDEX::pointcloud_point";   break;
  case ON_COMPONENT_INDEX::group_member:       s = "ON_COMPONENT_INDEX::group_member";       break;

  case ON_COMPONENT_INDEX::extrusion_bottom_profile: s = "ON_COMPONENT_INDEX::extrusion_bottom_profile"; break;
  case ON_COMPONENT_INDEX::extrusion_top_profile:    s = "ON_COMPONENT_INDEX::extrusion_top_profile";    break;
  case ON_COMPONENT_INDEX::extrusion_wall_edge:      s = "ON_COMPONENT_INDEX::extrusion_wall_edge";      break;
  case ON_COMPONENT_INDEX::extrusion_wall_surface:   s = "ON_COMPONENT_INDEX::extrusion_wall_surface";   break;
  case ON_COMPONENT_INDEX::extrusion_cap_surface:    s = "ON_COMPONENT_INDEX::extrusion_cap_surface";    break;
  case ON_COMPONENT_INDEX::extrusion_path:           s = "ON_COMPONENT_INDEX::extrusion_path";           break;

  case ON_COMPONENT_INDEX::subd_vertex:        s = "ON_COMPONENT_INDEX::subd_vertex";        break;
  case ON_COMPONENT_INDEX::subd_edge:          s = "ON_COMPONENT_INDEX::subd_edge";          break;
  case ON_COMPONENT_INDEX::subd_face:          s = "ON_COMPONENT_INDEX::subd_face";          break;

  case ON_COMPONENT_INDEX::hatch_loop:         s = "ON_COMPONENT_INDEX::hatch_loop";         break;

  case ON_COMPONENT_INDEX::dim_linear_point:   s = "ON_COMPONENT_INDEX::dim_linear_point";   break;
  case ON_COMPONENT_INDEX::dim_radial_point:   s = "ON_COMPONENT_INDEX::dim_radial_point";   break;
  case ON_COMPONENT_INDEX::dim_angular_point:  s = "ON_COMPONENT_INDEX::dim_angular_point";  break;
  case ON_COMPONENT_INDEX::dim_ordinate_point: s = "ON_COMPONENT_INDEX::dim_ordinate_point"; break;
  case ON_COMPONENT_INDEX::dim_text_point:     s = "ON_COMPONENT_INDEX::dim_text_point";     break;
  case ON_COMPONENT_INDEX::dim_centermark_point:     s = "ON_COMPONENT_INDEX::dim_centermark_point";     break;
  case ON_COMPONENT_INDEX::dim_leader_point:         s = "ON_COMPONENT_INDEX::dim_leader_point";         break;

  default: s = 0; break;
  }

  if ( 0 != s )
  {
    while ( str < str_end )
    {
      const char c = *s++;
      if (0 == c)
        break;

      *str++ = c;
    }
  }

  s = " m_index=";
  while ( str < str_end )
  {
    const char c = *s++;
    if (0 == c)
      break;

    *str++ = c;
  }

  if ( ci.m_index < 1 )
  {
    i = (unsigned int)(-ci.m_index);
    s = "-";
    while ( str < str_end )
    {
      const char c = *s++;
      if (0 == c)
        break;

      *str++ = c;
    }
  }
  else
  {
    i = (unsigned int)(ci.m_index);
  }
  
  j = sizeof(ubuffer)/sizeof(ubuffer[0]);
  j--;
  ubuffer[j] = 0;
  while(j > 0)
  {
    j--;
    ubuffer[j] = (char)('0'+i%10);
    i /= 10;
    if ( 0 == i )
      break;
  }

  s = &ubuffer[j];
  while ( str < str_end )
  {
    if ( 0 == (*str++ = *s++))
      break;
  }
}